

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pipeline.c
# Opt level: O0

CURLcode Curl_add_handle_to_pipeline(SessionHandle *handle,connectdata *conn)

{
  curl_llist_element *pcVar1;
  curl_llist *pipeline_00;
  CURLcode CVar2;
  CURLcode rc;
  curl_llist *pipeline;
  curl_llist_element *sendhead;
  connectdata *conn_local;
  SessionHandle *handle_local;
  
  pcVar1 = conn->send_pipe->head;
  pipeline_00 = conn->send_pipe;
  CVar2 = Curl_addHandleToPipeline(handle,pipeline_00);
  if ((pipeline_00 == conn->send_pipe) && (pcVar1 != conn->send_pipe->head)) {
    conn->writechannel_inuse = false;
    Curl_expire((SessionHandle *)conn->send_pipe->head->ptr,1);
  }
  return CVar2;
}

Assistant:

CURLcode Curl_add_handle_to_pipeline(struct SessionHandle *handle,
                                     struct connectdata *conn)
{
  struct curl_llist_element *sendhead = conn->send_pipe->head;
  struct curl_llist *pipeline;
  CURLcode rc;

  pipeline = conn->send_pipe;

  rc = Curl_addHandleToPipeline(handle, pipeline);

  if(pipeline == conn->send_pipe && sendhead != conn->send_pipe->head) {
    /* this is a new one as head, expire it */
    conn->writechannel_inuse = FALSE; /* not in use yet */
    Curl_expire(conn->send_pipe->head->ptr, 1);
  }

#if 0 /* enable for pipeline debugging */
  print_pipeline(conn);
#endif

  return rc;
}